

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O2

string * __thiscall OB::Parg::print_version_abi_cxx11_(string *__return_storage_ptr__,Parg *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,&this->name_," v");
  std::operator+(&bStack_58,&local_38,&this->version_);
  std::operator+(__return_storage_ptr__,&bStack_58,"\n");
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string print_version() const
  {
    return name_ + " v" + version_ + "\n";
  }